

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O2

S2Point * __thiscall S2PaddedCell::GetCenter(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int iVar1;
  S2Point SStack_28;
  
  iVar1 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  S2::FaceSiTitoXYZ(&SStack_28,(uint)((this->id_).id_ >> 0x3d),iVar1 + this->ij_lo_[0] * 2,
                    iVar1 + this->ij_lo_[1] * 2);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetCenter() const {
  int ij_size = S2CellId::GetSizeIJ(level_);
  unsigned int si = 2 * ij_lo_[0] + ij_size;
  unsigned int ti = 2 * ij_lo_[1] + ij_size;
  return S2::FaceSiTitoXYZ(id_.face(), si, ti).Normalize();
}